

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<pstore::gsl::span<unsigned_char,_1l>,void>
               (span<unsigned_char,__1L> *container,ostream *os)

{
  bool bVar1;
  reference value;
  type *elem;
  iterator __end0;
  iterator __begin0;
  span<unsigned_char,__1L> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  span<unsigned_char,__1L> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (span<unsigned_char,__1L> *)0x0;
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&__end0.index_);
  pstore::gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&elem);
  do {
    bVar1 = pstore::gsl::details::operator!=
                      ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&__end0.index_
                       ,(span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&elem);
    if (!bVar1) {
LAB_0012fe35:
      if (__range3 != (span<unsigned_char,__1L> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
            operator*((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&__end0.index_)
    ;
    if ((__range3 != (span<unsigned_char,__1L> *)0x0) &&
       (std::operator<<(os,','), __range3 == (span<unsigned_char,__1L> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0012fe35;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_char>(value,os);
    __range3 = (span<unsigned_char,__1L> *)
               ((long)&(__range3->storage_).super_extent_type<_1L>.size_ + 1);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&__end0.index_);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }